

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int ImGui::CalcTypematicPressedRepeatAmount
              (float t,float t_prev,float repeat_delay,float repeat_rate)

{
  undefined4 local_24;
  int count;
  float repeat_rate_local;
  float repeat_delay_local;
  float t_prev_local;
  float t_local;
  
  if ((t != 0.0) || (NAN(t))) {
    if ((t <= repeat_delay) || (repeat_rate <= 0.0)) {
      t_prev_local = 0.0;
    }
    else {
      local_24 = (float)((int)((t - repeat_delay) / repeat_rate) -
                        (int)((t_prev - repeat_delay) / repeat_rate));
      if ((int)local_24 < 1) {
        local_24 = 0.0;
      }
      t_prev_local = local_24;
    }
  }
  else {
    t_prev_local = 1.4013e-45;
  }
  return (int)t_prev_local;
}

Assistant:

int ImGui::CalcTypematicPressedRepeatAmount(float t, float t_prev, float repeat_delay, float repeat_rate)
{
    if (t == 0.0f)
        return 1;
    if (t <= repeat_delay || repeat_rate <= 0.0f)
        return 0;
    const int count = (int)((t - repeat_delay) / repeat_rate) - (int)((t_prev - repeat_delay) / repeat_rate);
    return (count > 0) ? count : 0;
}